

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall ON_Linetype::Read(ON_Linetype *this,ON_BinaryArchive *file)

{
  bool bVar1;
  LineCapStyle LVar2;
  LineJoinStyle LVar3;
  LengthUnitSystem units;
  wchar_t *component_name;
  ON_UUID *pOVar4;
  ON_LinetypePrivate *this_00;
  bool local_89;
  undefined1 local_88 [7];
  bool always;
  ON_SimpleArray<ON_2dPoint> taper;
  double dStack_68;
  uchar width_units;
  double width;
  undefined1 uStack_58;
  uchar join;
  uchar cap;
  uchar item_id;
  uint model_component_attributes_filter;
  ON_UUID linetype_id;
  ON_wString local_38;
  ON_wString linetype_name;
  int linetype_index;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_Linetype *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&Unset);
  iStack_24 = 0;
  linetype_index = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,&linetype_index);
  if (!bVar1) {
    return false;
  }
  linetype_name.m_s._7_1_ = 0;
  if (iStack_24 != 1) {
    if (iStack_24 == 2) {
      width._4_4_ = 0;
      bVar1 = ON_BinaryArchive::ReadModelComponentAttributes
                        (_minor_version,&this->super_ON_ModelComponent,(uint *)((long)&width + 4));
      if ((bVar1) &&
         (bVar1 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_private->m_segments), bVar1))
      {
        width._3_1_ = 0;
        if (0 < linetype_index) {
          bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
          if (!bVar1) goto LAB_006afb2c;
          if (width._3_1_ == 1) {
            width._2_1_ = 0;
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 2));
            if (!bVar1) goto LAB_006afb2c;
            LVar2 = ON::LineCapStyleFromUnsigned((uint)width._2_1_);
            this->m_cap_style = LVar2;
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
            if (!bVar1) goto LAB_006afb2c;
          }
          if (width._3_1_ == 2) {
            width._1_1_ = 0;
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 1));
            if (!bVar1) goto LAB_006afb2c;
            LVar3 = ON::LineJoinStyleFromUnsigned((uint)width._1_1_);
            this->m_join_style = LVar3;
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
            if (!bVar1) goto LAB_006afb2c;
          }
          if ((linetype_index == 1) && (width._3_1_ != 0)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
                       ,0x216,"","Bug in ON_Linetype::Read for chunk version 2.1");
          }
        }
        if (1 < linetype_index) {
          if (width._3_1_ == 3) {
            dStack_68 = 1.0;
            bVar1 = ON_BinaryArchive::ReadDouble(_minor_version,&stack0xffffffffffffff98);
            if (!bVar1) goto LAB_006afb2c;
            SetWidth(this,dStack_68);
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
            if (!bVar1) goto LAB_006afb2c;
          }
          if (width._3_1_ == 4) {
            taper.m_capacity._3_1_ = 0;
            bVar1 = ON_BinaryArchive::ReadChar
                              (_minor_version,(ON__UINT8 *)((long)&taper.m_capacity + 3));
            if (!bVar1) goto LAB_006afb2c;
            units = ON::LengthUnitSystemFromUnsigned((uint)taper.m_capacity._3_1_);
            SetWidthUnits(this,units);
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
            if (!bVar1) goto LAB_006afb2c;
          }
          if (width._3_1_ == 5) {
            ON_SimpleArray<ON_2dPoint>::ON_SimpleArray((ON_SimpleArray<ON_2dPoint> *)local_88);
            bVar1 = ON_BinaryArchive::ReadArray
                              (_minor_version,(ON_SimpleArray<ON_2dPoint> *)local_88);
            if (bVar1) {
              if (this->m_private == (ON_LinetypePrivate *)0x0) {
                this_00 = (ON_LinetypePrivate *)operator_new(0x38);
                memset(this_00,0,0x38);
                ON_LinetypePrivate::ON_LinetypePrivate(this_00);
                this->m_private = this_00;
              }
              ON_SimpleArray<ON_2dPoint>::operator=
                        (&this->m_private->m_taper_points,(ON_SimpleArray<ON_2dPoint> *)local_88);
              bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
              if (bVar1) {
                linetype_id.Data4[0] = '\0';
                linetype_id.Data4[1] = '\0';
                linetype_id.Data4[2] = '\0';
                linetype_id.Data4[3] = '\0';
              }
              else {
                linetype_id.Data4[0] = '\x04';
                linetype_id.Data4[1] = '\0';
                linetype_id.Data4[2] = '\0';
                linetype_id.Data4[3] = '\0';
              }
            }
            else {
              linetype_id.Data4[0] = '\x04';
              linetype_id.Data4[1] = '\0';
              linetype_id.Data4[2] = '\0';
              linetype_id.Data4[3] = '\0';
            }
            ON_SimpleArray<ON_2dPoint>::~ON_SimpleArray((ON_SimpleArray<ON_2dPoint> *)local_88);
            if (linetype_id.Data4._0_4_ != 0) goto LAB_006afb2c;
          }
          if ((linetype_index == 2) && (width._3_1_ != 0)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
                       ,0x243,"","Bug in ON_Linetype::Read for chunk version 2.2");
          }
        }
        if (2 < linetype_index) {
          if (width._3_1_ == 6) {
            local_89 = false;
            bVar1 = ON_BinaryArchive::ReadBool(_minor_version,&local_89);
            if (!bVar1) goto LAB_006afb2c;
            SetAlwaysModelDistances(this,(bool)(local_89 & 1));
            bVar1 = ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&width + 3));
            if (!bVar1) goto LAB_006afb2c;
          }
          if ((linetype_index == 3) && (width._3_1_ != 0)) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linetype.cpp"
                       ,0x256,"","Bug in ON_Linetype::Read for chunk version 2.3");
          }
        }
        if (6 < width._3_1_) {
          width._3_1_ = 0;
        }
        linetype_name.m_s._7_1_ = 1;
      }
    }
    goto LAB_006afb2c;
  }
  linetype_name.m_s._0_4_ = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
  bVar1 = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&linetype_name);
  if (!bVar1) goto LAB_006afb2c;
  ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,(int)linetype_name.m_s);
  ON_wString::ON_wString(&local_38);
  ON_ModelComponent::GetName(&this->super_ON_ModelComponent,&local_38);
  bVar1 = ON_BinaryArchive::ReadString(_minor_version,&local_38);
  if (bVar1) {
    component_name = ON_wString::operator_cast_to_wchar_t_(&local_38);
    ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
    bVar1 = ON_BinaryArchive::ReadArray(_minor_version,&this->m_private->m_segments);
    if (bVar1) {
      if (0 < linetype_index) {
        pOVar4 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
        _uStack_58 = pOVar4->Data1;
        unique0x100003f3 = pOVar4->Data2;
        unique0x100003f5 = pOVar4->Data3;
        linetype_id._0_8_ = *(undefined8 *)pOVar4->Data4;
        bVar1 = ON_BinaryArchive::ReadUuid(_minor_version,(ON_UUID *)&uStack_58);
        if (!bVar1) goto LAB_006af6fc;
        ON_ModelComponent::SetId(&this->super_ON_ModelComponent,(ON_UUID *)&uStack_58);
      }
      linetype_name.m_s._7_1_ = 1;
    }
  }
LAB_006af6fc:
  linetype_id.Data4[0] = '\x02';
  linetype_id.Data4[1] = '\0';
  linetype_id.Data4[2] = '\0';
  linetype_id.Data4[3] = '\0';
  ON_wString::~ON_wString(&local_38);
LAB_006afb2c:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
  if (!bVar1) {
    linetype_name.m_s._7_1_ = 0;
  }
  return (bool)(linetype_name.m_s._7_1_ & 1);
}

Assistant:

bool ON_Linetype::Read( ON_BinaryArchive& file)
{
  *this = ON_Linetype::Unset;

  int major_version=0;
  int minor_version=0;
  if (!file.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version ))
    return false;

  bool rc = false;


  if( 1 == major_version ) 
  {
    for (;;)
    {
      // chunk version 1.0 fields
      int linetype_index = Index();
      if (!file.ReadInt(&linetype_index))
        break;
      SetIndex(linetype_index);

      ON_wString linetype_name;
      GetName(linetype_name);
      if (!file.ReadString(linetype_name))
        break;
      SetName(linetype_name);

      if (!file.ReadArray(m_private->m_segments))
        break;

      if (minor_version >= 1)
      {
        ON_UUID linetype_id = Id();
        if (!file.ReadUuid(linetype_id))
          break;
        SetId(linetype_id);
      }

      rc = true;
      break;
    }
  }
  else if ( 2 == major_version )
  {
    for (;;)
    {
      // chunk version 2.0 fields
      unsigned int model_component_attributes_filter = 0;
      if (!file.ReadModelComponentAttributes(*this,&model_component_attributes_filter))
        break;

      if (!file.ReadArray(m_private->m_segments))
        break;

      unsigned char item_id = 0;
      // 12 Aug 2021 S. Baer (RH-2285)
      // Add cap and join style to linetype
      if (minor_version >= 1)
      {
        if (!file.ReadChar(&item_id))
          break;

        if (ON_LinetypeTypeCodes::LineCap == item_id)
        {
          unsigned char cap = 0;
          if (!file.ReadChar(&cap))
            break;
          m_cap_style = ON::LineCapStyleFromUnsigned(cap);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (ON_LinetypeTypeCodes::LineJoin == item_id)
        {
          unsigned char join = 0;
          if (!file.ReadChar(&join))
            break;
          m_join_style = ON::LineJoinStyleFromUnsigned(join);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (1 == minor_version && item_id != 0)
        {
          ON_ERROR("Bug in ON_Linetype::Read for chunk version 2.1");
        }
      }

      // 12 Aug 2021 S. Baer (RH-2285)
      // Add cap and join style to linetype
      if (minor_version >= 2)
      {
        if (ON_LinetypeTypeCodes::Width == item_id)
        {
          double width = 1;
          if (!file.ReadDouble(&width))
            break;
          SetWidth(width);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (ON_LinetypeTypeCodes::WidthUnits == item_id)
        {
          unsigned char width_units = 0;
          if (!file.ReadChar(&width_units))
            break;
          SetWidthUnits(ON::LengthUnitSystemFromUnsigned(width_units));

          if (!file.ReadChar(&item_id))
            break;
        }

        if (ON_LinetypeTypeCodes::Taper == item_id)
        {
          ON_SimpleArray<ON_2dPoint> taper;
          if (!file.ReadArray(taper))
            break;
          if (nullptr == m_private)
            m_private = new ON_LinetypePrivate();
          m_private->m_taper_points = taper;

          if (!file.ReadChar(&item_id))
            break;
        }

        if (2 == minor_version && item_id != 0)
        {
          ON_ERROR("Bug in ON_Linetype::Read for chunk version 2.2");
        }
      }

      if (minor_version >= 3)
      {
        if (ON_LinetypeTypeCodes::AlwaysModelDistance == item_id)
        {
          bool always = false;
          if (!file.ReadBool(&always))
            break;
          SetAlwaysModelDistances(always);

          if (!file.ReadChar(&item_id))
            break;
        }

        if (3 == minor_version && item_id != 0)
        {
          ON_ERROR("Bug in ON_Linetype::Read for chunk version 2.3");
        }
      }

      if (item_id > ON_LinetypeTypeCodes::LastLinetypeTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 2)
        item_id = 0;
      }

      rc = true;
      break;
    }
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}